

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_53533::ParserImpl::ParseFunctionStatement(ParserImpl *this)

{
  FunctionStatement *in_RSI;
  ParserImpl *in_RDI;
  ParserImpl *in_stack_00000028;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> func_body;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> func_name;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *__p;
  ParserImpl *in_stack_ffffffffffffff90;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *this_00;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> func_name_00;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> local_40;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> local_38 [6];
  ParserImpl *this_01;
  
  func_name_00._M_head_impl = (SyntaxTree *)in_RDI;
  this_01 = in_RDI;
  NextToken(in_stack_ffffffffffffff90);
  if (*(int *)&in_RSI[1].func_name_._M_t.
               super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
               super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
               super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == 0x108) {
    ParseFunctionName(this_01);
    ParseFunctionBody(in_stack_00000028);
    operator_new(0x18);
    __p = local_38;
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff90,__p);
    this_00 = &local_40;
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
              (this_00,__p);
    luna::FunctionStatement::FunctionStatement
              (in_RSI,(unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      func_name_00._M_head_impl,
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RDI);
    std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
    unique_ptr<std::default_delete<luna::SyntaxTree>,void>(this_00,(pointer)__p);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RDI);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RDI);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RDI);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RDI);
    return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
           (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
           func_name_00._M_head_impl;
  }
  __assert_fail("current_.token_ == Token_Function",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp",
                0x195,
                "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseFunctionStatement()"
               );
}

Assistant:

std::unique_ptr<SyntaxTree> ParseFunctionStatement()
        {
            NextToken();                // skip 'function'
            assert(current_.token_ == Token_Function);

            std::unique_ptr<SyntaxTree> func_name = ParseFunctionName();
            std::unique_ptr<SyntaxTree> func_body = ParseFunctionBody();
            return std::unique_ptr<SyntaxTree>(new FunctionStatement(std::move(func_name),
                                                                     std::move(func_body)));
        }